

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int i4_partition_distinct_count(int n)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  uVar12 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar12 = (long)n * 4 + 4;
  }
  puVar4 = (undefined4 *)operator_new__(uVar12);
  *puVar4 = 1;
  if (0 < n) {
    uVar12 = 1;
    do {
      iVar11 = (int)uVar12;
      bVar2 = i4_is_triangular(iVar11);
      puVar4[uVar12] = (uint)bVar2;
      if (3 < uVar12) {
        iVar3 = puVar4[uVar12];
        uVar9 = 4;
        iVar6 = 7;
        iVar7 = 2;
        iVar1 = -1;
        iVar5 = 1;
        do {
          iVar8 = iVar1;
          iVar3 = iVar3 + puVar4[iVar11 - (int)uVar9] * iVar5;
          puVar4[uVar12] = iVar3;
          uVar9 = (ulong)(uint)(iVar6 * iVar7);
          iVar6 = iVar6 + 3;
          iVar7 = iVar7 + 1;
          iVar1 = iVar5;
          iVar5 = iVar8;
        } while (uVar9 <= uVar12);
      }
      if (1 < uVar12) {
        iVar3 = puVar4[uVar12];
        iVar6 = 5;
        iVar7 = 2;
        iVar8 = 2;
        iVar1 = -1;
        iVar5 = 1;
        do {
          iVar10 = iVar1;
          iVar3 = iVar3 + puVar4[iVar11 - iVar8] * iVar5;
          puVar4[uVar12] = iVar3;
          iVar8 = iVar6 * iVar7;
          iVar6 = iVar6 + 3;
          iVar7 = iVar7 + 1;
          iVar1 = iVar5;
          iVar5 = iVar10;
        } while ((long)iVar8 <= (long)uVar12);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != n + 1);
  }
  iVar11 = puVar4[n];
  operator_delete__(puVar4);
  return iVar11;
}

Assistant:

int i4_partition_distinct_count ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    I4_PARTITION_DISTINCT_COUNT returns any value of Q(N).
//
//  Discussion:
//
//    A partition of an integer N is a representation of the integer
//    as the sum of nonzero positive integers.  The order of the summands
//    does not matter.  The number of partitions of N is symbolized
//    by P(N).  Thus, the number 5 has P(N) = 7, because it has the
//    following partitions:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//      = 3 + 1 + 1
//      = 2 + 2 + 1
//      = 2 + 1 + 1 + 1
//      = 1 + 1 + 1 + 1 + 1
//
//    However, if we require that each member of the partition
//    be distinct, we are computing something symbolized by Q(N).
//    The number 5 has Q(N) = 3, because it has the following partitions
//    into distinct parts:
//
//    5 = 5
//      = 4 + 1
//      = 3 + 2
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    22 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the integer to be partitioned.
//
//    Output, int I4_PARTITION_DISTINCT_COUNT, the number of partitions 
//    of the integer into distinct parts.
//
{
  int *c;
  int i;
  int k;
  int k2;
  int k_sign;
  int value;

  c = new int[n+1];

  c[0] = 1;

  for ( i = 1; i <= n; i++ )
  {
    if ( i4_is_triangular ( i ) )
    {
      c[i] = 1;
    }
    else
    {
      c[i] = 0;
    }

    k = 0;
    k_sign = -1;

    for ( ; ; )
    {
      k = k + 1;
      k_sign = -k_sign;
      k2 = k * ( 3 * k + 1 );

      if ( i < k2 )
      {
        break;
      }

      c[i] = c[i] + k_sign * c[i-k2];

    }

    k = 0;
    k_sign = -1;

    for ( ; ; )
    {
      k = k + 1;
      k_sign = -k_sign;
      k2 = k * ( 3 * k - 1 );

      if ( i < k2 )
      {
        break;
      }

      c[i] = c[i] + k_sign * c[i-k2];

    }

  }

  value = c[n];

  delete [] c;

  return value;
}